

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O3

void helper_msa_adds_a_w_mips64(CPUMIPSState_conflict5 *env,uint32_t wd,uint32_t ws,uint32_t wt)

{
  fpr_t *pfVar1;
  fpr_t *pfVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  
  pfVar1 = (env->active_fpu).fpr + ws;
  pfVar2 = (env->active_fpu).fpr + wt;
  uVar3 = (int)pfVar1->fs[0] >> 0x1f;
  uVar5 = (int)pfVar1->fs[1] >> 0x1f;
  uVar7 = (int)pfVar1->fs[2] >> 0x1f;
  uVar9 = (int)pfVar1->fs[3] >> 0x1f;
  auVar12._0_4_ = (pfVar1->fs[0] ^ uVar3) - uVar3;
  uVar5 = (pfVar1->fs[1] ^ uVar5) - uVar5;
  uVar7 = (pfVar1->fs[2] ^ uVar7) - uVar7;
  uVar9 = (pfVar1->fs[3] ^ uVar9) - uVar9;
  uVar3 = (int)pfVar2->fs[0] >> 0x1f;
  uVar15 = (int)pfVar2->fs[1] >> 0x1f;
  uVar17 = (int)pfVar2->fs[2] >> 0x1f;
  uVar19 = (int)pfVar2->fs[3] >> 0x1f;
  uVar3 = (pfVar2->fs[0] ^ uVar3) - uVar3;
  uVar15 = (pfVar2->fs[1] ^ uVar15) - uVar15;
  uVar17 = (pfVar2->fs[2] ^ uVar17) - uVar17;
  uVar19 = (pfVar2->fs[3] ^ uVar19) - uVar19;
  auVar12._4_4_ = 0;
  auVar12._8_4_ = uVar5;
  auVar12._12_4_ = 0;
  auVar11._4_4_ = 0;
  auVar11._0_4_ = uVar7;
  auVar11._8_4_ = uVar9;
  auVar11._12_4_ = 0;
  uVar4 = -(uint)((int)(auVar12._0_4_ | uVar3) < 0);
  uVar6 = -(uint)((int)(uVar5 | uVar15) < 0);
  uVar8 = -(uint)((int)(uVar7 | uVar17) < 0);
  uVar10 = -(uint)((int)(uVar9 | uVar19) < 0);
  auVar22._0_8_ = 0x7fffffff - (ulong)uVar3;
  auVar22._8_8_ = 0x7fffffff - (ulong)uVar15;
  auVar21._0_8_ = 0x7fffffff - (ulong)uVar17;
  auVar21._8_8_ = 0x7fffffff - (ulong)uVar19;
  auVar11 = auVar11 ^ _DAT_00d58680;
  auVar21 = auVar21 ^ _DAT_00d58680;
  auVar13 = auVar12 ^ _DAT_00d58680;
  auVar22 = auVar22 ^ _DAT_00d58680;
  uVar14 = -(uint)(auVar13._4_4_ < auVar22._4_4_ ||
                  auVar22._4_4_ == auVar13._4_4_ && auVar13._0_4_ < auVar22._0_4_);
  uVar16 = -(uint)(auVar13._12_4_ < auVar22._12_4_ ||
                  auVar22._12_4_ == auVar13._12_4_ && auVar13._8_4_ < auVar22._8_4_);
  uVar18 = -(uint)(auVar11._4_4_ < auVar21._4_4_ ||
                  auVar21._4_4_ == auVar11._4_4_ && auVar11._0_4_ < auVar21._0_4_);
  uVar20 = -(uint)(auVar11._12_4_ < auVar21._12_4_ ||
                  auVar21._12_4_ == auVar11._12_4_ && auVar11._8_4_ < auVar21._8_4_);
  pfVar1 = (env->active_fpu).fpr + wd;
  pfVar1->fs[0] = uVar4 >> 1 | ~uVar4 & (~uVar14 & 0x7fffffff | uVar3 + auVar12._0_4_ & uVar14);
  pfVar1->fs[1] = uVar6 >> 1 | ~uVar6 & (~uVar16 & 0x7fffffff | uVar15 + uVar5 & uVar16);
  pfVar1->fs[2] = uVar8 >> 1 | ~uVar8 & (~uVar18 & 0x7fffffff | uVar17 + uVar7 & uVar18);
  pfVar1->fs[3] = uVar10 >> 1 | ~uVar10 & (~uVar20 & 0x7fffffff | uVar19 + uVar9 & uVar20);
  return;
}

Assistant:

void helper_msa_adds_a_w(CPUMIPSState *env,
                         uint32_t wd, uint32_t ws, uint32_t wt)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

    pwd->w[0]  = msa_adds_a_df(DF_WORD, pws->w[0],  pwt->w[0]);
    pwd->w[1]  = msa_adds_a_df(DF_WORD, pws->w[1],  pwt->w[1]);
    pwd->w[2]  = msa_adds_a_df(DF_WORD, pws->w[2],  pwt->w[2]);
    pwd->w[3]  = msa_adds_a_df(DF_WORD, pws->w[3],  pwt->w[3]);
}